

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O3

void __thiscall
TEST_MockParameterTest_mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed_Test::testBody
          (TEST_MockParameterTest_mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed_Test *this
          )

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SimpleString SStack_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::SimpleString(&SStack_38,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x60))
            ((long *)CONCAT44(extraout_var,iVar1),&SStack_38,1);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&SStack_38,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x58))
            ((long *)CONCAT44(extraout_var_00,iVar1),&SStack_38,1);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_28);
  SimpleString::SimpleString(&SStack_38,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x70))
            ((long *)CONCAT44(extraout_var_01,iVar1),&SStack_38,1);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_28,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_28);
  SimpleString::SimpleString(&SStack_38,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x48))
            ((long *)CONCAT44(extraout_var_02,iVar1),&SStack_38,1);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::SimpleString(&local_18,"");
  pMVar2 = mock(&local_18,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_18);
  return;
}

Assistant:

TEST(MockParameterTest, mismatchedIntegerTypesUnsignedAndUnsignedLongAreAllowed)
{
    mock().expectOneCall("foo").withParameter("parameter", (unsigned)1);
    mock().actualCall("foo").withParameter("parameter", (unsigned long)1);

    mock().expectOneCall("foo").withParameter("parameter", (unsigned long)1);
    mock().actualCall("foo").withParameter("parameter", (unsigned)1);

    mock().checkExpectations();
}